

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolsb.c
# Opt level: O0

int ffgclsb(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
           long elemincre,int nultyp,char nulval,char *array,char *nularray,int *anynul,int *status)

{
  char *pcVar1;
  char in_DL;
  int *unaff_RBX;
  uint in_ESI;
  char *in_RDI;
  size_t in_R8;
  FITSfile *in_R9;
  fitsfile *values;
  fitsfile *status_00;
  fitsfile *incre_00;
  int in_stack_00000008;
  char in_stack_00000010;
  long in_stack_00000018;
  void *in_stack_00000020;
  fitsfile *in_stack_00000028;
  fitsfile *in_stack_00000030;
  u_tag u;
  void *buffer;
  double cbuff [3600];
  char snull [20];
  char message [81];
  char tform [20];
  LONGLONG rowincre;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG tnull;
  LONGLONG readptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  int readcheck;
  int nulcheck;
  long ntodo;
  long xwidth;
  long ii;
  long incre;
  long twidth;
  int decimals;
  int xcode;
  int hdutype;
  int maxelem;
  int tcode;
  double dtemp;
  double power;
  double zero;
  double scale;
  fitsfile *nvals;
  fitsfile *fptr_00;
  fitsfile *fptr_01;
  long *status_01;
  long *buffer_00;
  undefined1 *offset;
  fitsfile *fptr_02;
  char *gsize;
  fitsfile *fptr_03;
  size_t local_72a0;
  size_t local_7290;
  size_t local_7280;
  fitsfile *pfVar2;
  fitsfile *snull_00;
  fitsfile *pfVar3;
  fitsfile *implipower;
  undefined7 in_stack_ffffffffffff8db8;
  undefined1 in_stack_ffffffffffff8dbf;
  double *input;
  fitsfile *in_stack_ffffffffffff8dc8;
  int *in_stack_ffffffffffff8dd0;
  char *in_stack_ffffffffffff8dd8;
  double *in_stack_ffffffffffff8de0;
  double *in_stack_ffffffffffff8de8;
  char *in_stack_ffffffffffff8df0;
  long *in_stack_ffffffffffff8df8;
  int *in_stack_ffffffffffff8e00;
  int *in_stack_ffffffffffff8e08;
  LONGLONG *in_stack_ffffffffffff8e10;
  LONGLONG *in_stack_ffffffffffff8e18;
  long *in_stack_ffffffffffff8e20;
  LONGLONG *in_stack_ffffffffffff8e28;
  LONGLONG *in_stack_ffffffffffff8e30;
  int *in_stack_ffffffffffff8e38;
  LONGLONG *in_stack_ffffffffffff8e40;
  char *in_stack_ffffffffffff8e48;
  int *in_stack_ffffffffffff8e50;
  char local_1b8 [32];
  char local_198 [96];
  fitsfile local_138;
  long local_120;
  long local_118;
  size_t local_110;
  long local_108;
  long local_100;
  fitsfile local_f8;
  long local_e8;
  long local_e0;
  long local_d8;
  undefined4 local_d0;
  int local_cc;
  size_t local_c8;
  int in_stack_ffffffffffffff44;
  LONGLONG in_stack_ffffffffffffff48;
  long lVar4;
  long in_stack_ffffffffffffff50;
  long in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined1 local_90 [8];
  FITSfile *local_88;
  double local_80;
  double local_78;
  FITSfile *local_70;
  FITSfile *local_68;
  size_t local_60;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar5;
  
  local_80 = 1.0;
  local_d0 = 0;
  if ((in_stack_00000030->HDUposition < 1) && (in_R8 != 0)) {
    input = (double *)&stack0xffffffffffff8dc8;
    if (in_stack_00000028 != (fitsfile *)0x0) {
      in_stack_00000028->HDUposition = 0;
    }
    local_68 = in_R9;
    local_60 = in_R8;
    if (in_stack_00000008 == 2) {
      memset(in_stack_00000020,0,in_R8);
    }
    if ((long)local_68 < 0) {
      local_d0 = 0xffffffff;
    }
    incre_00 = &local_138;
    gsize = local_1b8;
    status_00 = (fitsfile *)&local_70;
    values = (fitsfile *)&local_78;
    nvals = (fitsfile *)&stack0xffffffffffffff58;
    fptr_00 = (fitsfile *)(local_90 + 4);
    fptr_01 = (fitsfile *)local_90;
    status_01 = &local_d8;
    buffer_00 = &local_100;
    offset = &stack0xffffffffffffff6c;
    fptr_02 = &local_f8;
    fptr_03 = in_stack_00000030;
    pfVar2 = nvals;
    snull_00 = fptr_00;
    pfVar3 = fptr_01;
    implipower = in_stack_00000030;
    ffgcprll(in_stack_ffffffffffff8dc8,(int)((ulong)input >> 0x20),
             CONCAT17(in_stack_ffffffffffff8dbf,in_stack_ffffffffffff8db8),
             (LONGLONG)in_stack_00000030,(LONGLONG)fptr_01,(int)((ulong)fptr_00 >> 0x20),
             in_stack_ffffffffffff8de0,in_stack_ffffffffffff8de8,in_stack_ffffffffffff8df0,
             in_stack_ffffffffffff8df8,in_stack_ffffffffffff8e00,in_stack_ffffffffffff8e08,
             in_stack_ffffffffffff8e10,in_stack_ffffffffffff8e18,in_stack_ffffffffffff8e20,
             in_stack_ffffffffffff8e28,in_stack_ffffffffffff8e30,in_stack_ffffffffffff8e38,
             in_stack_ffffffffffff8e40,in_stack_ffffffffffff8e48,in_stack_ffffffffffff8e50);
    if ((local_90._4_4_ == 0xe) && (local_68 == (FITSfile *)0x1)) {
      ffgcll((fitsfile *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_DL,
             (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),in_RDI,
             (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),unaff_RBX);
      iVar5 = in_stack_00000030->HDUposition;
    }
    else {
      pcVar1 = strchr((char *)&local_138,0x41);
      if (pcVar1 != (char *)0x0) {
        local_d8 = in_stack_ffffffffffffff58;
        if (in_stack_00000030->HDUposition == 0x134) {
          in_stack_00000030->HDUposition = 0;
          ffcmsg();
          local_d8 = in_stack_ffffffffffffff58;
        }
        local_90._4_4_ = 0xb;
        in_stack_ffffffffffffff50 = 1;
        in_stack_ffffffffffffff58 = 1;
        local_70 = (FITSfile *)0x3ff0000000000000;
        local_78 = 0.0;
        local_f8._0_8_ = 0x4995cdd1;
        local_90._0_4_ = 0x7080;
      }
      if (in_stack_00000030->HDUposition < 1) {
        in_stack_ffffffffffffff50 = (long)local_68 * in_stack_ffffffffffffff50;
        if ((local_90._4_4_ == 0x10) && (in_stack_ffffffffffffff6c == 1)) {
          ffasfm(in_stack_ffffffffffff8dd8,in_stack_ffffffffffff8dd0,
                 (long *)in_stack_ffffffffffff8dc8,(int *)input,
                 (int *)CONCAT17(in_stack_ffffffffffff8dbf,in_stack_ffffffffffff8db8));
          for (lVar4 = 0; lVar4 < in_stack_ffffffffffffff64; lVar4 = lVar4 + 1) {
            local_80 = local_80 * 10.0;
          }
        }
        local_cc = in_stack_00000008;
        if ((in_stack_00000008 == 1) && (in_stack_00000010 == '\0')) {
          local_cc = 0;
        }
        else if (((int)local_90._4_4_ % 10 == 1) && (local_f8._0_8_ == 0x4995cdd1)) {
          local_cc = 0;
        }
        else if ((local_90._4_4_ == 0x15) &&
                ((0x7fff < (long)local_f8._0_8_ || ((long)local_f8._0_8_ < -0x8000)))) {
          local_cc = 0;
        }
        else if ((local_90._4_4_ == 0xb) &&
                ((0xff < (long)local_f8._0_8_ || ((long)local_f8._0_8_ < 0)))) {
          local_cc = 0;
        }
        else if ((local_90._4_4_ == 0x10) && (local_1b8[0] == '\x01')) {
          local_cc = 0;
        }
        local_110 = local_60;
        local_118 = 0;
        local_108 = 0;
        while (local_110 != 0) {
          if ((long)local_110 < (long)(int)local_90._0_4_) {
            local_7280 = local_110;
          }
          else {
            local_7280 = (size_t)(int)local_90._0_4_;
          }
          if ((long)local_68 < 0) {
            if ((long)local_7280 < local_e8 / -(long)local_68 + 1) {
              local_72a0 = local_7280;
            }
            else {
              local_72a0 = local_e8 / -(long)local_68 + 1;
            }
            local_c8 = local_72a0;
          }
          else {
            if ((long)local_7280 < ((local_d8 - local_e8) + -1) / (long)local_68 + 1) {
              local_7290 = local_7280;
            }
            else {
              local_7290 = ((local_d8 - local_e8) + -1) / (long)local_68 + 1;
            }
            local_c8 = local_7290;
          }
          local_f8.Fptr =
               (FITSfile *)
               (local_e0 + local_108 * local_100 +
               local_e8 * (in_stack_ffffffffffffff50 / (long)local_68));
          if (local_90._4_4_ == 0xb) {
            ffgi1b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(uchar *)values,
                   &status_00->HDUposition);
            values = (fitsfile *)(in_stack_00000018 + local_118);
            status_00 = in_stack_00000028;
            incre_00 = in_stack_00000030;
            fffi1s1((uchar *)(in_stack_00000018 + local_118),local_c8,(double)local_70,local_78,
                    local_cc,(uchar)local_f8.HDUposition,in_stack_00000010,
                    (char *)((long)in_stack_00000020 + local_118),&in_stack_00000028->HDUposition,
                    (char *)values,&in_stack_00000030->HDUposition);
          }
          else if (local_90._4_4_ == 0x10) {
            ffmbyt(fptr_00,(LONGLONG)nvals,(int)((ulong)incre_00 >> 0x20),&values->HDUposition);
            if (in_stack_ffffffffffffff50 == in_stack_ffffffffffffff58) {
              ffgbyt(fptr_02,(LONGLONG)offset,buffer_00,(int *)status_01);
            }
            else {
              ffgbytoff(fptr_03,(long)gsize,(long)fptr_02,(long)offset,buffer_00,(int *)status_01);
            }
            status_00 = (fitsfile *)((long)in_stack_00000020 + local_118);
            incre_00 = (fitsfile *)(in_stack_00000018 + local_118);
            values = in_stack_00000028;
            nvals = in_stack_00000030;
            fffstrs1(in_stack_ffffffffffff8dd8,(long)in_stack_ffffffffffff8dd0,
                     (double)in_stack_ffffffffffff8dc8,(double)input,
                     CONCAT17(in_stack_ffffffffffff8dbf,in_stack_ffffffffffff8db8),
                     (double)implipower,(int)((ulong)pfVar3 >> 0x20),(char *)snull_00,
                     (char)((ulong)pfVar2 >> 0x38),in_stack_ffffffffffff8df0,
                     (int *)in_stack_ffffffffffff8df8,(char *)in_stack_ffffffffffff8e00,
                     in_stack_ffffffffffff8e08);
          }
          else if (local_90._4_4_ == 0x15) {
            ffgi2b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(short *)values,
                   &status_00->HDUposition);
            values = (fitsfile *)(in_stack_00000018 + local_118);
            status_00 = in_stack_00000028;
            incre_00 = in_stack_00000030;
            fffi2s1((short *)input,local_c8,(double)local_70,local_78,local_cc,
                    (short)local_f8.HDUposition,in_stack_00000010,
                    (char *)((long)in_stack_00000020 + local_118),&in_stack_00000028->HDUposition,
                    (char *)values,&in_stack_00000030->HDUposition);
          }
          else if (local_90._4_4_ == 0x29) {
            ffgi4b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,&values->HDUposition,
                   &status_00->HDUposition);
            values = (fitsfile *)(in_stack_00000018 + local_118);
            status_00 = in_stack_00000028;
            incre_00 = in_stack_00000030;
            fffi4s1((int *)input,local_c8,(double)local_70,local_78,local_cc,local_f8.HDUposition,
                    in_stack_00000010,(char *)((long)in_stack_00000020 + local_118),
                    &in_stack_00000028->HDUposition,(char *)values,&in_stack_00000030->HDUposition);
          }
          else if (local_90._4_4_ == 0x2a) {
            ffgr4b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(float *)values,
                   &status_00->HDUposition);
            status_00 = (fitsfile *)(in_stack_00000018 + local_118);
            values = in_stack_00000030;
            fffr4s1((float *)input,local_c8,(double)local_70,local_78,local_cc,in_stack_00000010,
                    (char *)((long)in_stack_00000020 + local_118),&in_stack_00000028->HDUposition,
                    (char *)status_00,&in_stack_00000030->HDUposition);
          }
          else if (local_90._4_4_ == 0x51) {
            ffgi8b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(long *)values,
                   &status_00->HDUposition);
            values = (fitsfile *)(in_stack_00000018 + local_118);
            status_00 = in_stack_00000028;
            incre_00 = in_stack_00000030;
            fffi8s1((LONGLONG *)input,local_c8,(double)local_70,local_78,local_cc,local_f8._0_8_,
                    in_stack_00000010,(char *)((long)in_stack_00000020 + local_118),
                    &in_stack_00000028->HDUposition,(char *)values,&in_stack_00000030->HDUposition);
          }
          else {
            if (local_90._4_4_ != 0x52) {
              snprintf(local_198,0x51,"Cannot read bytes from column %d which has format %s",
                       (ulong)in_ESI,&local_138);
              ffpmsg((char *)0x1aae2c);
              if (in_stack_ffffffffffffff6c == 1) {
                in_stack_00000030->HDUposition = 0x137;
                return 0x137;
              }
              in_stack_00000030->HDUposition = 0x138;
              return 0x138;
            }
            ffgr8b(fptr_01,(LONGLONG)fptr_00,(long)nvals,(long)incre_00,(double *)values,
                   &status_00->HDUposition);
            status_00 = (fitsfile *)(in_stack_00000018 + local_118);
            values = in_stack_00000030;
            fffr8s1(input,local_c8,(double)local_70,local_78,local_cc,in_stack_00000010,
                    (char *)((long)in_stack_00000020 + local_118),&in_stack_00000028->HDUposition,
                    (char *)status_00,&in_stack_00000030->HDUposition);
          }
          if (0 < in_stack_00000030->HDUposition) {
            local_88 = (FITSfile *)(double)local_118;
            if (in_stack_ffffffffffffff6c < 1) {
              snprintf(local_198,0x51,"Error reading elements %.0f thru %.0f from image (ffgclsb).",
                       (double)local_88 + 1.0,(double)local_88 + (double)(long)local_c8);
            }
            else {
              snprintf(local_198,0x51,
                       "Error reading elements %.0f thru %.0f from column %d (ffgclsb).",
                       (double)local_88 + 1.0,(double)local_88 + (double)(long)local_c8,
                       (ulong)in_ESI);
            }
            ffpmsg((char *)0x1aaf3c);
            return in_stack_00000030->HDUposition;
          }
          local_110 = local_110 - local_c8;
          if (local_110 != 0) {
            local_118 = local_c8 + local_118;
            local_e8 = local_e8 + local_c8 * (long)local_68;
            if (local_e8 < local_d8) {
              if (local_e8 < 0) {
                local_120 = (-1 - local_e8) / local_d8 + 1;
                local_108 = local_108 - local_120;
                local_e8 = local_120 * local_d8 + local_e8;
              }
            }
            else {
              local_120 = local_e8 / local_d8;
              local_108 = local_120 + local_108;
              local_e8 = local_e8 - local_120 * local_d8;
            }
          }
        }
        if (in_stack_00000030->HDUposition == -0xb) {
          ffpmsg((char *)0x1ab0af);
          in_stack_00000030->HDUposition = 0x19c;
        }
        iVar5 = in_stack_00000030->HDUposition;
      }
      else {
        iVar5 = in_stack_00000030->HDUposition;
      }
    }
  }
  else {
    iVar5 = in_stack_00000030->HDUposition;
  }
  return iVar5;
}

Assistant:

int ffgclsb(fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            long  elemincre,  /* I - pixel increment; e.g., 2 = every other  */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            signed char nulval,   /* I - value for null pixels if nultyp = 1 */
            signed char *array,   /* O - array of values that are read       */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer be a virtual column in a 1 or more grouped FITS primary
  array or image extension.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The output array of values will be converted from the datatype of the column 
  and will be scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    double scale, zero, power = 1., dtemp;
    int tcode, maxelem, hdutype, xcode, decimals;
    long twidth, incre;
    long ii, xwidth, ntodo;
    int nulcheck, readcheck = 0;
    LONGLONG repeat, startpos, elemnum, readptr, tnull;
    LONGLONG rowlen, rownum, remain, next, rowincre;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value if reading from ASCII table  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    union u_tag {
       char charval;
       signed char scharval;
    } u;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    buffer = cbuff;

    if (anynul)
        *anynul = 0;

    if (nultyp == 2)      
       memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (elemincre < 0)
        readcheck = -1;  /* don't do range checking in this case */

    ffgcprll( fptr, colnum, firstrow, firstelem, nelem, readcheck, &scale, &zero,
         tform, &twidth, &tcode, &maxelem, &startpos, &elemnum, &incre,
         &repeat, &rowlen, &hdutype, &tnull, snull, status);

    /* special case: read column of T/F logicals */
    if (tcode == TLOGICAL && elemincre == 1)
    {
        u.scharval = nulval;
        ffgcll(fptr, colnum, firstrow, firstelem, nelem, nultyp,
               u.charval, (char *) array, nularray, anynul, status);

        return(*status);
    }

    if (strchr(tform,'A') != NULL) 
    {
        if (*status == BAD_ELEM_NUM)
        {
            /* ignore this error message */
            *status = 0;
            ffcmsg();   /* clear error stack */
        }

        /*  interpret a 'A' ASCII column as a 'B' byte column ('8A' == '8B') */
        /*  This is an undocumented 'feature' in CFITSIO */

        /*  we have to reset some of the values returned by ffgcpr */
        
        tcode = TBYTE;
        incre = 1;         /* each element is 1 byte wide */
        repeat = twidth;   /* total no. of chars in the col */
        twidth = 1;        /* width of each element */
        scale = 1.0;       /* no scaling */
        zero  = 0.0;
        tnull = NULL_UNDEFINED;  /* don't test for nulls */
        maxelem = DBUFFSIZE;
    }

    if (*status > 0)
        return(*status);
        
    incre *= elemincre;   /* multiply incre to just get every nth pixel */

    if (tcode == TSTRING && hdutype == ASCII_TBL) /* setup for ASCII tables */
    {
      /* get the number of implied decimal places if no explicit decmal point */
      ffasfm(tform, &xcode, &xwidth, &decimals, status); 
      for(ii = 0; ii < decimals; ii++)
        power *= 10.;
    }
    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default, check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (tcode%10 == 1 &&        /* if reading an integer column, and  */ 
            tnull == NULL_UNDEFINED) /* if a null value is not defined,    */
            nulcheck = 0;            /* then do not check for null values. */

    else if (tcode == TSHORT && (tnull > SHRT_MAX || tnull < SHRT_MIN) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TBYTE && (tnull > 255 || tnull < 0) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TSTRING && snull[0] == ASCII_NULL_UNDEFINED)
         nulcheck = 0;

    /*---------------------------------------------------------------------*/
    /*  Now read the pixels from the FITS column. If the column does not   */
    /*  have the same datatype as the output array, then we have to read   */
    /*  the raw values into a temporary buffer (of limited size).  In      */
    /*  the case of a vector colum read only 1 vector of values at a time  */
    /*  then skip to the next row if more values need to be read.          */
    /*  After reading the raw values, then call the fffXXYY routine to (1) */
    /*  test for undefined values, (2) convert the datatype if necessary,  */
    /*  and (3) scale the values by the FITS TSCALn and TZEROn linear      */
    /*  scaling parameters.                                                */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to read */
    next = 0;                 /* next element in array to be read   */
    rownum = 0;               /* row number, relative to firstrow   */

    while (remain)
    {
        /* limit the number of pixels to read at one time to the number that
           will fit in the buffer or to the number of pixels that remain in
           the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);
        if (elemincre >= 0)
        {
          ntodo = (long) minvalue(ntodo, ((repeat - elemnum - 1)/elemincre +1));
        }
        else
        {
          ntodo = (long) minvalue(ntodo, (elemnum/(-elemincre) +1));
        }

        readptr = startpos + (rownum * rowlen) + (elemnum * (incre / elemincre));

        switch (tcode) 
        {
            case (TBYTE):
                ffgi1b(fptr, readptr, ntodo, incre, (unsigned char *) &array[next], status);
                fffi1s1((unsigned char *)&array[next], ntodo, scale, zero,
                        nulcheck, (unsigned char) tnull, nulval, &nularray[next], 
                        anynul, &array[next], status);
                break;
            case (TSHORT):
                ffgi2b(fptr, readptr, ntodo, incre, (short *) buffer, status);
                fffi2s1((short  *) buffer, ntodo, scale, zero, nulcheck, 
                       (short) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONG):
                ffgi4b(fptr, readptr, ntodo, incre, (INT32BIT *) buffer,
                       status);
                fffi4s1((INT32BIT *) buffer, ntodo, scale, zero, nulcheck, 
                       (INT32BIT) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONGLONG):
                ffgi8b(fptr, readptr, ntodo, incre, (long *) buffer, status);
                fffi8s1( (LONGLONG *) buffer, ntodo, scale, zero, 
                           nulcheck, tnull, nulval, &nularray[next], 
                            anynul, &array[next], status);
                break;
            case (TFLOAT):
                ffgr4b(fptr, readptr, ntodo, incre, (float  *) buffer, status);
                fffr4s1((float  *) buffer, ntodo, scale, zero, nulcheck, 
                       nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TDOUBLE):
                ffgr8b(fptr, readptr, ntodo, incre, (double *) buffer, status);
                fffr8s1((double *) buffer, ntodo, scale, zero, nulcheck, 
                          nulval, &nularray[next], anynul, 
                          &array[next], status);
                break;
            case (TSTRING):
                ffmbyt(fptr, readptr, REPORT_EOF, status);
       
                if (incre == twidth)    /* contiguous bytes */
                     ffgbyt(fptr, ntodo * twidth, buffer, status);
                else
                     ffgbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);

                /* interpret the string as an ASCII formated number */
                fffstrs1((char *) buffer, ntodo, scale, zero, twidth, power,
                      nulcheck, snull, nulval, &nularray[next], anynul,
                      &array[next], status);
                break;

            default:  /*  error trap for invalid column format */
                snprintf(message, FLEN_ERRMSG,
                   "Cannot read bytes from column %d which has format %s",
                    colnum, tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous read operation */
        {
	  dtemp = (double) next;
          if (hdutype > 0)
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from column %d (ffgclsb).",
              dtemp+1., dtemp+ntodo, colnum);
          else
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from image (ffgclsb).",
              dtemp+1., dtemp+ntodo);

         ffpmsg(message);
         return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum = elemnum + (ntodo * elemincre);

            if (elemnum >= repeat)  /* completed a row; start on later row */
            {
                rowincre = elemnum / repeat;
                rownum += rowincre;
                elemnum = elemnum - (rowincre * repeat);
            }
            else if (elemnum < 0)  /* completed a row; start on a previous row */
            {
                rowincre = (-elemnum - 1) / repeat + 1;
                rownum -= rowincre;
                elemnum = (rowincre * repeat) + elemnum;
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
        ffpmsg(
        "Numerical overflow during type conversion while reading FITS data.");
        *status = NUM_OVERFLOW;
    }

    return(*status);
}